

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall
crnlib::symbol_codec::encode
          (symbol_codec *this,uint bit,adaptive_bit_model *model,bool update_model)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  output_symbol in_RAX;
  uint uVar4;
  bool bVar5;
  output_symbol sym;
  output_symbol local_28;
  
  this->m_arith_total_bits = this->m_arith_total_bits + 1;
  local_28 = in_RAX;
  if (this->m_simulate_encoding == false) {
    local_28.m_num_bits = -1;
    local_28.m_bits = bit;
    local_28.m_arith_prob0 = model->m_bit_0_prob;
    vector<crnlib::symbol_codec::output_symbol>::push_back(&this->m_output_syms,&local_28);
  }
  uVar2 = model->m_bit_0_prob;
  uVar4 = this->m_arith_length;
  uVar3 = (uVar4 >> 0xb) * (uint)uVar2;
  if (bit == 0) {
    if (update_model) {
      model->m_bit_0_prob = (short)(0x800 - uVar2 >> 5) + uVar2;
    }
    this->m_arith_length = uVar3;
  }
  else {
    if (update_model) {
      model->m_bit_0_prob = uVar2 - (uVar2 >> 5);
    }
    uVar4 = uVar4 - uVar3;
    puVar1 = &this->m_arith_base;
    bVar5 = CARRY4(*puVar1,uVar3);
    *puVar1 = *puVar1 + uVar3;
    this->m_arith_length = uVar4;
    uVar3 = uVar4;
    if (bVar5) {
      arith_propagate_carry(this);
      uVar3 = this->m_arith_length;
    }
  }
  if (uVar3 < 0x1000000) {
    arith_renorm_enc_interval(this);
  }
  return;
}

Assistant:

void symbol_codec::encode(uint bit, adaptive_bit_model& model, bool update_model)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);

        m_arith_total_bits++;

        if (!m_simulate_encoding)
        {
            output_symbol sym;
            sym.m_bits = bit;
            sym.m_num_bits = -1;
            sym.m_arith_prob0 = model.m_bit_0_prob;
            m_output_syms.push_back(sym);
        }

        //uint x = gArithProbMulTab[model.m_bit_0_prob >> (cSymbolCodecArithProbBits - cSymbolCodecArithProbMulBits)][m_arith_length >> (32 - cSymbolCodecArithProbMulLenSigBits)] << 16;
        uint x = model.m_bit_0_prob * (m_arith_length >> cSymbolCodecArithProbBits);

        if (!bit)
        {
            if (update_model)
            {
                model.m_bit_0_prob += ((cSymbolCodecArithProbScale - model.m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);
            }

            m_arith_length = x;
        }
        else
        {
            if (update_model)
            {
                model.m_bit_0_prob -= (model.m_bit_0_prob >> cSymbolCodecArithProbMoveBits);
            }

            uint orig_base = m_arith_base;
            m_arith_base += x;
            m_arith_length -= x;
            if (orig_base > m_arith_base)
            {
                arith_propagate_carry();
            }
        }

        if (m_arith_length < cSymbolCodecArithMinLen)
        {
            arith_renorm_enc_interval();
        }
    }